

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool __thiscall Json::Reader::recoverFromError(Reader *this,TokenType skipUntilToken)

{
  Errors *this_00;
  bool bVar1;
  size_type __new_size;
  Token skip;
  Token local_40;
  
  this_00 = &this->errors_;
  __new_size = std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::size
                         (this_00);
  do {
    bVar1 = readToken(this,&local_40);
    if (!bVar1) {
      std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::resize
                (this_00,__new_size);
    }
  } while ((local_40.type_ != skipUntilToken) && (local_40.type_ != tokenEndOfStream));
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::resize
            (this_00,__new_size);
  return false;
}

Assistant:

bool Reader::recoverFromError(TokenType skipUntilToken) {
  size_t const errorCount = errors_.size();
  Token skip;
  for (;;) {
    if (!readToken(skip))
      errors_.resize(errorCount); // discard errors caused by recovery
    if (skip.type_ == skipUntilToken || skip.type_ == tokenEndOfStream)
      break;
  }
  errors_.resize(errorCount);
  return false;
}